

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O0

int Abc_NtkRenodeEvalMv(If_Man_t *p,If_Cut_t *pCut)

{
  int iVar1;
  int nVars;
  char *pcVar2;
  uint *puVar3;
  uint *puVar4;
  int local_2c;
  int RetValue;
  int i;
  char *pPerm;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  pcVar2 = If_CutPerm(pCut);
  for (local_2c = 0; iVar1 = If_CutLeaveNum(pCut), local_2c < iVar1; local_2c = local_2c + 1) {
    pcVar2[local_2c] = '\x01';
  }
  puVar3 = If_CutTruth(p,pCut);
  iVar1 = If_CutLeaveNum(pCut);
  iVar1 = Kit_TruthIsop(puVar3,iVar1,s_vMemory,0);
  if (iVar1 == -1) {
    p_local._4_4_ = 0xfff;
  }
  else {
    if ((iVar1 != 0) && (iVar1 != 1)) {
      __assert_fail("RetValue == 0 || RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                    ,299,"int Abc_NtkRenodeEvalMv(If_Man_t *, If_Cut_t *)");
    }
    puVar3 = If_CutTruth(p,pCut);
    puVar4 = If_CutTruth(p,pCut);
    iVar1 = If_CutLeaveNum(pCut);
    Kit_TruthNot(puVar3,puVar4,iVar1);
    puVar3 = If_CutTruth(p,pCut);
    iVar1 = If_CutLeaveNum(pCut);
    iVar1 = Kit_TruthIsop(puVar3,iVar1,s_vMemory2,0);
    puVar3 = If_CutTruth(p,pCut);
    puVar4 = If_CutTruth(p,pCut);
    nVars = If_CutLeaveNum(pCut);
    Kit_TruthNot(puVar3,puVar4,nVars);
    if (iVar1 == -1) {
      p_local._4_4_ = 0xfff;
    }
    else {
      if ((iVar1 != 0) && (iVar1 != 1)) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRenode.c"
                      ,0x132,"int Abc_NtkRenodeEvalMv(If_Man_t *, If_Cut_t *)");
      }
      iVar1 = If_CutLeaveNum(pCut);
      p_local._4_4_ = Abc_NodeEvalMvCost(iVar1,s_vMemory,s_vMemory2);
      if (0xffe < p_local._4_4_) {
        p_local._4_4_ = 0xfff;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NtkRenodeEvalMv( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    int i, RetValue;
    // set internal mapper parameters
    for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        pPerm[i] = 1;
    // compute ISOP for the positive phase
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory, 0 );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    // compute ISOP for the negative phase
    Kit_TruthNot( If_CutTruth(p, pCut), If_CutTruth(p, pCut), If_CutLeaveNum(pCut) );
    RetValue = Kit_TruthIsop( If_CutTruth(p, pCut), If_CutLeaveNum(pCut), s_vMemory2, 0 );
    Kit_TruthNot( If_CutTruth(p, pCut), If_CutTruth(p, pCut), If_CutLeaveNum(pCut) );
    if ( RetValue == -1 )
        return IF_COST_MAX;
    assert( RetValue == 0 || RetValue == 1 );
    // return the cost of the cut 
    RetValue = Abc_NodeEvalMvCost( If_CutLeaveNum(pCut), s_vMemory, s_vMemory2 );
    if ( RetValue >= IF_COST_MAX )
        return IF_COST_MAX;
    return RetValue;
}